

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O3

void __thiscall dynamicgraph::TracerRealTime::TracerRealTime(TracerRealTime *this,string *n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  string doc;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar3 = (n->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar3,pcVar3 + n->_M_string_length);
  dynamicgraph::Tracer::Tracer(&this->super_Tracer,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  *(undefined ***)this = &PTR__TracerRealTime_001125a0;
  this->bufferSize = 0x100000;
  (this->hardFiles).
  super__List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->hardFiles;
  (this->hardFiles).
  super__List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->hardFiles;
  (this->hardFiles).
  super__List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"Trash the current content of the buffers, without saving it.","");
  command::docCommandVoid0(&local_70,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"empty","");
  command::makeCommandVoid0<dynamicgraph::TracerRealTime>
            ((command *)this,(TracerRealTime *)emptyBuffers,0,&local_70);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"getBufferSize","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bufferSize","");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"int","");
  command::docDirectGetter(&local_90,&local_d0,&local_b0);
  command::makeDirectGetter<dynamicgraph::TracerRealTime,int>(this,&this->bufferSize,&local_90);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"setBufferSize","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bufferSize","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"int","");
  command::docDirectSetter(&local_90,&local_d0,&local_b0);
  command::makeDirectSetter<dynamicgraph::TracerRealTime,int>(this,&this->bufferSize,&local_90);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TracerRealTime::TracerRealTime(const std::string &n)
    : Tracer(n), bufferSize(BUFFER_SIZE_DEFAULT) {
  dgDEBUGINOUT(15);

  /* --- Commands --- */
  {
    using namespace dynamicgraph::command;
    std::string doc = docCommandVoid0(
        "Trash the current content of the buffers, without saving it.");
    addCommand("empty",
               makeCommandVoid0(*this, &TracerRealTime::emptyBuffers, doc));

    addCommand("getBufferSize",
               makeDirectGetter(*this, &bufferSize,
                                docDirectGetter("bufferSize", "int")));
    addCommand("setBufferSize",
               makeDirectSetter(*this, &bufferSize,
                                docDirectSetter("bufferSize", "int")));
  }  // using namespace command

  dgDEBUGOUT(15);
}